

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.cpp
# Opt level: O0

void __thiscall Propagator::propagate(Propagator *this,Wave *wave)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  long lVar4;
  Propagator *this_00;
  Wave *this_01;
  reference pvVar5;
  uint *in_RSI;
  long in_RDI;
  array<int,_4UL> *value;
  const_iterator it_end;
  const_iterator it;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *patterns;
  uint i2;
  int y2;
  int x2;
  int dy;
  int dx;
  uint direction;
  uint pattern;
  uint x1;
  uint y1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  uint *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_60;
  reference local_58;
  uint local_50;
  uint local_4c;
  uint local_48;
  int local_44;
  int local_40;
  uint local_3c;
  uint local_1c;
  int local_18;
  int local_14;
  uint *local_10;
  
  local_10 = in_RSI;
  do {
    sVar2 = std::
            vector<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
            ::size((vector<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
                    *)(in_RDI + 0x30));
    if (sVar2 == 0) {
      return;
    }
    pvVar3 = std::
             vector<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
             ::back((vector<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
                     *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    std::tie<unsigned_int,unsigned_int,unsigned_int>
              (in_stack_ffffffffffffff58,
               (uint *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               (uint *)in_stack_ffffffffffffff48);
    std::tuple<unsigned_int&,unsigned_int&,unsigned_int&>::operator=
              ((tuple<unsigned_int_&,_unsigned_int_&,_unsigned_int_&> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               (tuple<unsigned_int,_unsigned_int,_unsigned_int> *)in_stack_ffffffffffffff48);
    std::
    vector<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
    ::pop_back((vector<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
                *)0x1128f4);
    for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
      local_40 = directions_x[local_3c];
      local_44 = directions_y[local_3c];
      if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
        local_48 = local_18 + local_40;
        local_4c = local_14 + local_44;
        if ((((-1 < (int)local_48) && ((int)local_48 < (int)local_10[0x3a])) && (-1 < (int)local_4c)
            ) && ((int)local_4c < (int)local_10[0x3b])) goto LAB_001129f6;
      }
      else {
        local_48 = (local_18 + local_40 + local_10[0x3a]) % local_10[0x3a];
        local_4c = (local_14 + local_44 + local_10[0x3b]) % local_10[0x3b];
LAB_001129f6:
        local_50 = local_48 + local_4c * local_10[0x3a];
        std::
        vector<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
        ::operator[]((vector<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
                      *)(in_RDI + 8),(ulong)local_1c);
        local_58 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>::
                   operator[]((array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>
                               *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              (size_type)in_stack_ffffffffffffff48);
        local_60._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               (in_stack_ffffffffffffff48);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff48);
        while (bVar1 = __gnu_cxx::operator<
                                 ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                  (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   *)in_stack_ffffffffffffff48), bVar1) {
          lVar4 = in_RDI + 0x48;
          this_00 = (Propagator *)(long)(int)local_4c;
          __gnu_cxx::
          __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator*(&local_60);
          this_01 = (Wave *)Array3D<std::array<int,_4UL>_>::get
                                      ((Array3D<std::array<int,_4UL>_> *)
                                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                                       ,(size_t)in_stack_ffffffffffffff58,
                                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                                       ,(size_t)in_stack_ffffffffffffff48);
          pvVar5 = std::array<int,_4UL>::operator[]
                             ((array<int,_4UL> *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              (size_type)in_stack_ffffffffffffff48);
          *pvVar5 = *pvVar5 + -1;
          pvVar5 = std::array<int,_4UL>::operator[]
                             ((array<int,_4UL> *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              (size_type)in_stack_ffffffffffffff48);
          if (*pvVar5 == 0) {
            in_stack_ffffffffffffff50 = local_4c;
            in_stack_ffffffffffffff54 = local_48;
            __gnu_cxx::
            __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
            ::operator*(&local_60);
            add_to_propagator(this_00,(uint)((ulong)lVar4 >> 0x20),(uint)lVar4,
                              in_stack_ffffffffffffff64);
            in_stack_ffffffffffffff58 = local_10;
            in_stack_ffffffffffffff64 = local_50;
            __gnu_cxx::
            __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
            ::operator*(&local_60);
            Wave::set(this_01,(uint)((ulong)in_RDI >> 0x20),(uint)in_RDI,
                      SUB81((ulong)pvVar3 >> 0x38,0));
          }
          __gnu_cxx::
          __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++(&local_60);
        }
      }
    }
  } while( true );
}

Assistant:

void Propagator::propagate(Wave &wave) noexcept {

  // We propagate every element while there is element to propagate.
  while (propagating.size() != 0) {

    // The cell and pattern that has been set to false.
    unsigned y1, x1, pattern;
    std::tie(y1, x1, pattern) = propagating.back();
    propagating.pop_back();

    // We propagate the information in all 4 directions.
    for (unsigned direction = 0; direction < 4; direction++) {

      // We get the next cell in the direction direction.
      int dx = directions_x[direction];
      int dy = directions_y[direction];
      int x2, y2;
      if (periodic_output) {
        x2 = ((int)x1 + dx + (int)wave.width) % wave.width;
        y2 = ((int)y1 + dy + (int)wave.height) % wave.height;
      } else {
        x2 = x1 + dx;
        y2 = y1 + dy;
        if (x2 < 0 || x2 >= (int)wave.width) {
          continue;
        }
        if (y2 < 0 || y2 >= (int)wave.height) {
          continue;
        }
      }

      // The index of the second cell, and the patterns compatible
      unsigned i2 = x2 + y2 * wave.width;
      const std::vector<unsigned> &patterns =
        propagator_state[pattern][direction];

      // For every pattern that could be placed in that cell without being in
      // contradiction with pattern1
      for (auto it = patterns.begin(), it_end = patterns.end(); it < it_end;
           ++it) {

        // We decrease the number of compatible patterns in the opposite
        // direction If the pattern was discarded from the wave, the element
        // is still negative, which is not a problem
        std::array<int, 4> &value = compatible.get(y2, x2, *it);
        value[direction]--;

        // If the element was set to 0 with this operation, we need to remove
        // the pattern from the wave, and propagate the information
        if (value[direction] == 0) {
          add_to_propagator(y2, x2, *it);
          wave.set(i2, *it, false);
        }
      }
    }
  }
}